

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

void __thiscall
glcts::LayoutBindingProgram::LayoutBindingProgram
          (LayoutBindingProgram *this,IProgramContextSupplier *contextSupplier)

{
  RenderContext *renderCtx;
  int iVar1;
  eStageType eVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Functions *pFVar3;
  ShaderProgram *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar4;
  ProgramSources sources;
  allocator<char> local_14a;
  allocator<char> local_149;
  value_type local_148;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  ProgramSources local_100;
  
  this->_vptr_LayoutBindingProgram = (_func_int **)&PTR__LayoutBindingProgram_02143f00;
  this->m_contextSupplier = contextSupplier;
  iVar1 = (*contextSupplier->_vptr_IProgramContextSupplier[2])(contextSupplier);
  this->m_context = *(RenderContext **)(CONCAT44(extraout_var,iVar1) + 8);
  eVar2 = (*contextSupplier->_vptr_IProgramContextSupplier[4])(contextSupplier);
  this->m_stage = eVar2;
  iVar1 = (*contextSupplier->_vptr_IProgramContextSupplier[3])(contextSupplier);
  this->m_testParams = (LayoutBindingParameters *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*contextSupplier->_vptr_IProgramContextSupplier[2])(contextSupplier);
  pFVar3 = (Functions *)(**(code **)(**(long **)(CONCAT44(extraout_var_01,iVar1) + 8) + 0x18))();
  this->m_gl = pFVar3;
  iVar1 = (*this->_vptr_LayoutBindingProgram[2])(this);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_context;
  if (iVar1 == 2) {
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_100._193_8_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    memset(&local_100,0,0xac);
    iVar1 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])(this->m_contextSupplier,2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,*(char **)CONCAT44(extraout_var_02,iVar1),&local_14a);
    local_128._0_4_ = 5;
    local_128._8_8_ = local_118._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_128 + 8),local_148._M_dataplus._M_p,
               local_148._M_dataplus._M_p + local_148._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources + (uint)local_128._0_4_,(value_type *)(local_128 + 8));
    glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_100);
    this->m_program = this_00;
    if ((char *)local_128._8_8_ != local_118._M_local_buf + 8) {
      operator_delete((void *)local_128._8_8_,local_118._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_100.attribLocationBindings);
    lVar4 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_100.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar4));
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != -0x18);
  }
  else {
    iVar1 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])(this->m_contextSupplier,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_128,*(char **)CONCAT44(extraout_var_03,iVar1),&local_14a);
    iVar1 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])(this->m_contextSupplier,1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,*(char **)CONCAT44(extraout_var_04,iVar1),&local_149);
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_100._193_8_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_100.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    memset(&local_100,0,0xac);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources,(value_type *)local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_100.sources + 1,&local_148);
    glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_100);
    this->m_program = this_00;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_100.attribLocationBindings);
    lVar4 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_100.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar4));
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != -0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_128._4_4_,local_128._0_4_) != &local_118) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_128._4_4_,local_128._0_4_),
                      local_118._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

LayoutBindingProgram(IProgramContextSupplier& contextSupplier)
		: m_contextSupplier(contextSupplier)
		, m_context(contextSupplier.getContext().getRenderContext())
		, m_stage(contextSupplier.getStage())
		, m_testParams(contextSupplier.getTestParameters())
		, m_gl(contextSupplier.getContext().getRenderContext().getFunctions())
	{
		if (getStage() != ComputeShader)
			m_program = new glu::ShaderProgram(
				m_context, glu::makeVtxFragSources(m_contextSupplier.getSource(VertexShader).c_str(),
												   m_contextSupplier.getSource(FragmentShader).c_str()));
		else
			m_program = new glu::ShaderProgram(
				m_context,
				glu::ProgramSources() << glu::ComputeSource(m_contextSupplier.getSource(ComputeShader).c_str()));
	}